

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_specific.cc
# Opt level: O0

void highwayhash::SetThreadAffinity(ThreadAffinity *affinity)

{
  int iVar1;
  ThreadAffinity *pTVar2;
  int err;
  pid_t pid;
  ThreadAffinity *original;
  ThreadAffinity *affinity_local;
  
  pTVar2 = anon_unknown_0::OriginalThreadAffinity();
  if (pTVar2 == (ThreadAffinity *)0x0) {
    printf("os_specific CHECK failed at line %d\n",0xa1);
    abort();
  }
  iVar1 = sched_setaffinity(0,0x80,(cpu_set_t *)affinity);
  if (iVar1 == 0) {
    return;
  }
  printf("os_specific CHECK failed at line %d\n",0xaa);
  abort();
}

Assistant:

void SetThreadAffinity(ThreadAffinity* affinity) {
  // Ensure original is initialized before changing.
  const ThreadAffinity* const original = OriginalThreadAffinity();
  CHECK(original != nullptr);

#if OS_WIN
  const HANDLE hThread = GetCurrentThread();
  const DWORD_PTR prev = SetThreadAffinityMask(hThread, affinity->mask);
  CHECK(prev != 0);
#elif OS_LINUX
  const pid_t pid = 0;  // current thread
  const int err = sched_setaffinity(pid, sizeof(cpu_set_t), &affinity->set);
  CHECK(err == 0);
#elif OS_FREEBSD
  const pid_t pid = getpid();  // current thread
  const int err = cpuset_setaffinity(CPU_LEVEL_WHICH, CPU_WHICH_PID, pid,
                                     sizeof(cpuset_t), &affinity->set);
  CHECK(err == 0);
#elif OS_MAC
  const int err = mac_setaffinity(&affinity->set);
  CHECK(err == 0);
#else
#error "port"
#endif
}